

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise1D::forward
          (ConvolutionDepthWise1D *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  int ret;
  int outw;
  int kernel_extent_w;
  size_t elemsize;
  int w;
  Mat bottom_blob_bordered;
  Mat *_bias_data;
  Mat bias_data_flattened;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_w;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  Option *in_stack_fffffffffffffce0;
  void **ppvVar2;
  Mat *in_stack_fffffffffffffce8;
  Mat *in_stack_fffffffffffffcf0;
  size_type __n;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  undefined1 local_250 [4];
  int *piVar3;
  undefined4 uVar4;
  ConvolutionDepthWise1D *in_stack_fffffffffffffdc8;
  void *local_200;
  int *local_1f8;
  undefined8 local_1f0;
  undefined4 local_1e8;
  long *local_1e0;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  int local_1c8;
  long local_1c0;
  undefined4 local_1b8;
  void *local_1a8;
  int *local_1a0;
  undefined8 local_198;
  undefined4 local_190;
  long *local_188;
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 local_178;
  undefined4 local_174;
  int local_170;
  long local_168;
  int local_160;
  int local_15c;
  reference local_158;
  const_reference local_150;
  const_reference local_148;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_138;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_130;
  int local_11c;
  void **local_118;
  void **local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  void **local_f0;
  
  __n = 0;
  local_138 = in_RDX;
  local_130 = in_RSI;
  local_148 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_150 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_130,1);
  local_158 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_138,__n);
  local_15c = local_150->w;
  local_160 = local_150->c;
  local_118 = &local_1a8;
  local_1a8 = (void *)0x0;
  local_1a0 = (int *)0x0;
  local_198 = 0;
  local_190 = 0;
  local_188 = (long *)0x0;
  local_180 = 0;
  local_17c = 0;
  local_178 = 0;
  local_174 = 0;
  local_170 = 0;
  local_168 = 0;
  flatten(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  if (local_1a8 == (void *)0x0 || local_168 * local_170 == 0) {
    local_11c = -100;
    local_1b8 = 1;
    goto LAB_01ac454d;
  }
  local_110 = &local_200;
  local_200 = (void *)0x0;
  local_1f8 = (int *)0x0;
  local_1f0 = 0;
  local_1e8 = 0;
  local_1e0 = (long *)0x0;
  local_1d8 = 0;
  local_1d4 = 0;
  local_1d0 = 0;
  local_1cc = 0;
  local_1c8 = 0;
  local_1c0 = 0;
  if (*(int *)(in_RDI + 0xec) == 0) {
LAB_01ac3ddc:
    local_108 = local_250;
    _local_250 = (void *)0x0;
    piVar3 = (int *)0x0;
    uVar4 = 0;
    make_padding(in_stack_fffffffffffffdc8,(Mat *)0x0,(Mat *)0x0,0,
                 (Option *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    local_11c = -100;
    local_1b8 = 1;
    local_100 = local_250;
    if (piVar3 != (int *)0x0) {
      LOCK();
      iVar1 = *piVar3;
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if ((iVar1 == 1) && (_local_250 != (void *)0x0)) {
        free(_local_250);
      }
    }
  }
  else {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_130,2);
    flatten(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    if (local_200 != (void *)0x0 && local_1c0 * local_1c8 != 0) goto LAB_01ac3ddc;
    local_11c = -100;
    local_1b8 = 1;
  }
  ppvVar2 = &local_200;
  local_f0 = ppvVar2;
  if (local_1f8 != (int *)0x0) {
    LOCK();
    iVar1 = *local_1f8;
    *local_1f8 = *local_1f8 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_1e0 == (long *)0x0) {
        if (local_200 != (void *)0x0) {
          free(local_200);
        }
      }
      else {
        (**(code **)(*local_1e0 + 0x18))(local_1e0,local_200);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
LAB_01ac454d:
  ppvVar2 = &local_1a8;
  if (local_1a0 != (int *)0x0) {
    LOCK();
    iVar1 = *local_1a0;
    *local_1a0 = *local_1a0 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_188 == (long *)0x0) {
        if (local_1a8 != (void *)0x0) {
          free(local_1a8);
        }
      }
      else {
        (**(code **)(*local_188 + 0x18))(local_188,local_1a8);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return local_11c;
}

Assistant:

int ConvolutionDepthWise1D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _num_output = _weight_data.c;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, _kernel_w, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;

    top_blob.create(outw, _num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolutiondepthwise1d(bottom_blob_bordered, top_blob, weight_data_flattened, bias_data_flattened, _kernel_w, stride_w, dilation_w, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}